

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeMergeEngineStep(MergeEngine *pMerger,int *pbEof)

{
  long lVar1;
  ulong uVar2;
  uint *in_RSI;
  int *in_RDI;
  long in_FS_OFFSET;
  int iRes;
  PmaReader *pReadr2;
  PmaReader *pReadr1;
  int i;
  SortSubtask *pTask;
  int iPrev;
  int rc;
  int bCached;
  uint local_50;
  int local_4c;
  PmaReader *in_stack_ffffffffffffffb8;
  ulong local_40;
  uint local_34;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = *(uint *)(*(long *)(in_RDI + 4) + 4);
  lVar1 = *(long *)(in_RDI + 2);
  local_50 = vdbePmaReaderNext(in_stack_ffffffffffffffb8);
  if (local_50 == 0) {
    local_c = 0;
    local_40 = *(long *)(in_RDI + 6) + (long)(int)(local_34 & 0xfffe) * 0x50;
    uVar2 = *(long *)(in_RDI + 6) + (long)(int)(local_34 | 1) * 0x50;
    local_34 = *in_RDI + local_34;
    while (local_34 = (int)local_34 / 2, 0 < (int)local_34) {
      if (*(long *)(local_40 + 0x18) == 0) {
        local_4c = 1;
      }
      else if (*(long *)(uVar2 + 0x18) == 0) {
        local_4c = -1;
      }
      else {
        local_4c = (**(code **)(lVar1 + 0x38))
                             (lVar1,&local_c,*(undefined8 *)(local_40 + 0x28),
                              *(undefined4 *)(local_40 + 0x14),*(undefined8 *)(uVar2 + 0x28),
                              *(undefined4 *)(uVar2 + 0x14));
      }
      if ((local_4c < 0) || ((local_4c == 0 && (local_40 < uVar2)))) {
        *(int *)(*(long *)(in_RDI + 4) + (long)(int)local_34 * 4) =
             (int)((long)(local_40 - *(long *)(in_RDI + 6)) / 0x50);
        uVar2 = *(long *)(in_RDI + 6) +
                (long)*(int *)(*(long *)(in_RDI + 4) + (long)(int)(local_34 ^ 1) * 4) * 0x50;
        local_c = 0;
      }
      else {
        if (*(long *)(local_40 + 0x18) != 0) {
          local_c = 0;
        }
        *(int *)(*(long *)(in_RDI + 4) + (long)(int)local_34 * 4) =
             (int)((long)(uVar2 - *(long *)(in_RDI + 6)) / 0x50);
        local_40 = *(long *)(in_RDI + 6) +
                   (long)*(int *)(*(long *)(in_RDI + 4) + (long)(int)(local_34 ^ 1) * 4) * 0x50;
      }
    }
    *in_RSI = (uint)(*(long *)(*(long *)(in_RDI + 6) +
                               (long)*(int *)(*(long *)(in_RDI + 4) + 4) * 0x50 + 0x18) == 0);
  }
  if (local_50 == 0) {
    local_50 = (uint)*(byte *)(*(long *)(lVar1 + 0x18) + 0x1f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_50;
}

Assistant:

static int vdbeMergeEngineStep(
  MergeEngine *pMerger,      /* The merge engine to advance to the next row */
  int *pbEof                 /* Set TRUE at EOF.  Set false for more content */
){
  int rc;
  int iPrev = pMerger->aTree[1];/* Index of PmaReader to advance */
  SortSubtask *pTask = pMerger->pTask;

  /* Advance the current PmaReader */
  rc = vdbePmaReaderNext(&pMerger->aReadr[iPrev]);

  /* Update contents of aTree[] */
  if( rc==SQLITE_OK ){
    int i;                      /* Index of aTree[] to recalculate */
    PmaReader *pReadr1;         /* First PmaReader to compare */
    PmaReader *pReadr2;         /* Second PmaReader to compare */
    int bCached = 0;

    /* Find the first two PmaReaders to compare. The one that was just
    ** advanced (iPrev) and the one next to it in the array.  */
    pReadr1 = &pMerger->aReadr[(iPrev & 0xFFFE)];
    pReadr2 = &pMerger->aReadr[(iPrev | 0x0001)];

    for(i=(pMerger->nTree+iPrev)/2; i>0; i=i/2){
      /* Compare pReadr1 and pReadr2. Store the result in variable iRes. */
      int iRes;
      if( pReadr1->pFd==0 ){
        iRes = +1;
      }else if( pReadr2->pFd==0 ){
        iRes = -1;
      }else{
        iRes = pTask->xCompare(pTask, &bCached,
            pReadr1->aKey, pReadr1->nKey, pReadr2->aKey, pReadr2->nKey
        );
      }

      /* If pReadr1 contained the smaller value, set aTree[i] to its index.
      ** Then set pReadr2 to the next PmaReader to compare to pReadr1. In this
      ** case there is no cache of pReadr2 in pTask->pUnpacked, so set
      ** pKey2 to point to the record belonging to pReadr2.
      **
      ** Alternatively, if pReadr2 contains the smaller of the two values,
      ** set aTree[i] to its index and update pReadr1. If vdbeSorterCompare()
      ** was actually called above, then pTask->pUnpacked now contains
      ** a value equivalent to pReadr2. So set pKey2 to NULL to prevent
      ** vdbeSorterCompare() from decoding pReadr2 again.
      **
      ** If the two values were equal, then the value from the oldest
      ** PMA should be considered smaller. The VdbeSorter.aReadr[] array
      ** is sorted from oldest to newest, so pReadr1 contains older values
      ** than pReadr2 iff (pReadr1<pReadr2).  */
      if( iRes<0 || (iRes==0 && pReadr1<pReadr2) ){
        pMerger->aTree[i] = (int)(pReadr1 - pMerger->aReadr);
        pReadr2 = &pMerger->aReadr[ pMerger->aTree[i ^ 0x0001] ];
        bCached = 0;
      }else{
        if( pReadr1->pFd ) bCached = 0;
        pMerger->aTree[i] = (int)(pReadr2 - pMerger->aReadr);
        pReadr1 = &pMerger->aReadr[ pMerger->aTree[i ^ 0x0001] ];
      }
    }
    *pbEof = (pMerger->aReadr[pMerger->aTree[1]].pFd==0);
  }

  return (rc==SQLITE_OK ? pTask->pUnpacked->errCode : rc);
}